

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmain.cpp
# Opt level: O2

int vm_get_game_type_for_file(char *filename)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  char buf [16];
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    sVar2 = fread(buf,0x10,1,__stream);
    if (sVar2 == 1) {
      iVar1 = bcmp(buf,"TADS2 bin\n\r\x1a",0xc);
      if (iVar1 == 0) {
        iVar1 = 2;
      }
      else {
        iVar1 = bcmp(buf,"T3-image\r\n\x1a",0xb);
        iVar1 = (uint)(iVar1 == 0) * 5 + -2;
      }
    }
    else {
      iVar1 = -2;
    }
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

static int vm_get_game_type_for_file(const char *filename)
{
    osfildef *fp;
    char buf[16];
    int ret;
    
    /* try opening the filename exactly as given */
    fp = osfoprb(filename, OSFTBIN);

    /* if the file doesn't exist, tell the caller */
    if (fp == 0)
        return VM_GGT_NOT_FOUND;

    /* read the first few bytes of the file, where the signature resides */
    if (osfrb(fp, buf, 16))
    {
        /* 
         *   error reading the file - any valid game file is going to be at
         *   least long enough to hold the number of bytes we asked for, so
         *   it must not be a valid file 
         */
        ret = VM_GGT_INVALID;
    }
    else
    {
        /* check the signature we read against the known signatures */
        if (memcmp(buf, "TADS2 bin\012\015\032", 12) == 0)
            ret = VM_GGT_TADS2;
        else if (memcmp(buf, "T3-image\015\012\032", 11) == 0)
            ret = VM_GGT_TADS3;
        else
            ret = VM_GGT_INVALID;
    }

    /* close the file */
    osfcls(fp);

    /* return the version identifier */
    return ret;
}